

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void av1_nonrd_use_partition
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
               TokenExtra **tp,int mi_row,int mi_col,BLOCK_SIZE bsize,PC_TREE *pc_tree)

{
  PARTITION_TYPE PVar1;
  BLOCK_SIZE BVar2;
  uint mi_row_00;
  uint mi_col_00;
  AV1_COMMON *cm_00;
  long lVar3;
  PICK_MODE_CONTEXT *pPVar4;
  PC_TREE *pPVar5;
  TileDataEnc *in_RCX;
  ThreadData_conflict *in_RDX;
  AV1_COMP *in_RSI;
  long in_RDI;
  MB_MODE_INFO **in_R8;
  uint in_R9D;
  int unaff_retaddr;
  BLOCK_SIZE BStack0000000000000008;
  BLOCK_SIZE in_stack_00000010;
  undefined7 in_stack_00000011;
  PARTITION_TYPE *in_stack_00000018;
  int ii;
  int jj;
  int y_idx;
  int x_idx;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int change_none_to_split;
  RD_STATS dummy_cost;
  int pl;
  BLOCK_SIZE subsize;
  PARTITION_TYPE partition;
  int hbs;
  int bs;
  ModeCosts *mode_costs;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  TileInfo *tile_info;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  int in_stack_00000124;
  TokenExtra **in_stack_00000128;
  undefined4 in_stack_00000134;
  undefined7 in_stack_00000139;
  AV1_COMP *in_stack_00000148;
  TileInfo *in_stack_00000150;
  TileDataEnc *in_stack_00000158;
  int in_stack_00000160;
  undefined4 in_stack_00000164;
  BLOCK_SIZE in_stack_00000168;
  undefined7 in_stack_00000169;
  PC_TREE *in_stack_00000170;
  PARTITION_TYPE in_stack_00000178;
  BLOCK_SIZE in_stack_00000180;
  undefined7 in_stack_00000181;
  int in_stack_00000188;
  undefined4 in_stack_0000018c;
  int in_stack_00000190;
  int in_stack_00000198;
  BLOCK_SIZE in_stack_000001a0;
  int in_stack_000001a8;
  PC_TREE *in_stack_000001b0;
  int in_stack_00000630;
  int in_stack_00000634;
  MB_MODE_INFO **in_stack_00000638;
  TileDataEnc *in_stack_00000640;
  ThreadData_conflict *in_stack_00000648;
  AV1_COMP *in_stack_00000650;
  BLOCK_SIZE in_stack_00000660;
  TileDataEnc *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  AV1_COMMON *in_stack_fffffffffffffef8;
  MODE_EVAL_TYPE in_stack_ffffffffffffff07;
  MACROBLOCK *in_stack_ffffffffffffff08;
  AV1_COMP *in_stack_ffffffffffffff10;
  int local_e4;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff38;
  int iVar7;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int iVar8;
  TileDataEnc *in_stack_ffffffffffffff48;
  AV1_COMP *in_stack_ffffffffffffff50;
  RUN_TYPE in_stack_ffffffffffffff60;
  BLOCK_SIZE in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff74;
  MACROBLOCK *x_00;
  TileDataEnc *xd_00;
  TileDataEnc *tile_data_00;
  BLOCK_SIZE bsize_00;
  long lVar9;
  undefined4 in_stack_ffffffffffffffb0;
  ThreadData_conflict *pTVar10;
  AV1_COMP *pAVar11;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  lVar3 = in_RDI + 0x3c188;
  xd_00 = (TileDataEnc *)((in_RSI->enc_quant_dequant_params).quants.y_quant + 0x19);
  x_00 = (MACROBLOCK *)((in_RSI->enc_quant_dequant_params).quants.y_quant_fp + 0x22);
  mi_row_00 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [in_stack_00000010];
  mi_col_00 = mi_row_00 / 2;
  pTVar10 = in_RDX;
  pAVar11 = in_RSI;
  if (in_stack_00000010 < BLOCK_8X8) {
    PVar1 = '\0';
  }
  else {
    PVar1 = get_partition(cm_00,in_R9D,_BStack0000000000000008,in_stack_00000010);
  }
  BVar2 = get_partition_subsize
                    ((BLOCK_SIZE)((ulong)in_stack_fffffffffffffee0 >> 0x30),
                     (PARTITION_TYPE)((ulong)in_stack_fffffffffffffee0 >> 0x28));
  if (in_stack_00000010 < BLOCK_8X8) {
    local_e4 = 0;
  }
  else {
    local_e4 = partition_plane_context
                         ((MACROBLOCKD *)xd_00,in_R9D,_BStack0000000000000008,in_stack_00000010);
  }
  av1_invalid_rd_stats((RD_STATS *)&stack0xffffffffffffff48);
  if (((int)in_R9D < *(int *)(lVar3 + 0xc)) && (_BStack0000000000000008 < *(int *)(lVar3 + 0x10))) {
    *(TXFM_CONTEXT **)((xd_00->tctx).newmv_cdf + 1) =
         (cm_00->above_contexts).txfm[*(int *)&(in_RDX->mb).plane[0].qcoeff] +
         _BStack0000000000000008;
    *(long *)((xd_00->tctx).newmv_cdf[2] + 1) =
         (long)(xd_00->tctx).newmv_cdf[3] + (long)(int)(in_R9D & 0x1f) + 4;
    set_mode_eval_params
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff07);
    *(bool *)((long)((in_RSI->td).mb.mode_costs.intra_tx_type_costs[1][2] + 3) + 0x22) =
         *(int *)(in_RDI + 0x60cd0) != 0;
    iVar8 = 0;
    tile_data_00 = xd_00;
    lVar9 = lVar3;
    if ((PVar1 == '\0') && (*(int *)(in_RDI + 0x60ca4) == 1)) {
      in_stack_fffffffffffffef0 =
           CONCAT44((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),_BStack0000000000000008);
      in_stack_fffffffffffffef8 =
           (AV1_COMMON *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(uint)in_stack_00000010);
      iVar8 = try_split_partition((AV1_COMP *)CONCAT71(in_stack_00000169,in_stack_00000168),
                                  (ThreadData_conflict *)
                                  CONCAT44(in_stack_00000164,in_stack_00000160),in_stack_00000158,
                                  in_stack_00000150,(TokenExtra **)in_stack_00000148,
                                  (MACROBLOCK *)pc_tree,
                                  (MACROBLOCKD *)CONCAT71(in_stack_00000181,in_stack_00000180),
                                  (CommonModeInfoParams *)
                                  CONCAT44(in_stack_0000018c,in_stack_00000188),in_stack_00000190,
                                  in_stack_00000198,in_stack_000001a0,in_stack_000001a8,
                                  in_stack_000001b0);
      in_stack_fffffffffffffed8 = xd_00;
      if (iVar8 != 0) {
        PVar1 = '\x03';
        BVar2 = get_partition_subsize
                          ((BLOCK_SIZE)((ulong)lVar3 >> 0x30),(PARTITION_TYPE)((ulong)lVar3 >> 0x28)
                          );
      }
    }
    *in_stack_00000018 = PVar1;
    switch(PVar1) {
    case '\0':
      if (*(long *)(in_stack_00000018 + 8) == 0) {
        pPVar4 = av1_alloc_pmc((AV1_COMP *)x,xd._7_1_,(PC_TREE_SHARED_BUFFERS *)mode_costs);
        bsize_00 = (BLOCK_SIZE)lVar9;
        *(PICK_MODE_CONTEXT **)(in_stack_00000018 + 8) = pPVar4;
        if (*(long *)(in_stack_00000018 + 8) == 0) {
          aom_internal_error(*(aom_internal_error_info **)
                              ((tile_data_00->tctx).palette_uv_color_index_cdf[1][2] + 2),
                             AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
        }
      }
      else {
        av1_reset_pmc((PICK_MODE_CONTEXT *)0x12ebb7c);
        bsize_00 = (BLOCK_SIZE)lVar9;
      }
      pick_sb_modes_nonrd(in_RSI,tile_data_00,x_00,mi_row_00,mi_col_00,
                          (RD_STATS *)
                          CONCAT17(PVar1,CONCAT16(BVar2,CONCAT24(in_stack_ffffffffffffff74,local_e4)
                                                 )),bsize_00,(PICK_MODE_CONTEXT *)cm_00);
      encode_b_nonrd(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     (ThreadData_conflict *)CONCAT44(iVar8,in_stack_ffffffffffffff40),
                     (TokenExtra **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff68,(PARTITION_TYPE)local_e4,
                     (PICK_MODE_CONTEXT *)CONCAT44(mi_row_00,mi_col_00),(int *)x_00);
      break;
    case '\x01':
      for (iVar7 = 0; iVar7 < 2; iVar7 = iVar7 + 1) {
        if (*(long *)(in_stack_00000018 + (long)iVar7 * 8 + 0x10) == 0) {
          pPVar4 = av1_alloc_pmc((AV1_COMP *)x,xd._7_1_,(PC_TREE_SHARED_BUFFERS *)mode_costs);
          *(PICK_MODE_CONTEXT **)(in_stack_00000018 + (long)iVar7 * 8 + 0x10) = pPVar4;
          if (*(long *)(in_stack_00000018 + (long)iVar7 * 8 + 0x10) == 0) {
            aom_internal_error(*(aom_internal_error_info **)
                                ((tile_data_00->tctx).palette_uv_color_index_cdf[1][2] + 2),
                               AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
          }
        }
        else {
          av1_reset_pmc((PICK_MODE_CONTEXT *)0x12ebf9a);
        }
      }
      pick_sb_modes_nonrd(in_RSI,tile_data_00,x_00,mi_row_00,mi_col_00,
                          (RD_STATS *)
                          CONCAT17(PVar1,CONCAT16(BVar2,CONCAT24(in_stack_ffffffffffffff74,local_e4)
                                                 )),(BLOCK_SIZE)lVar9,(PICK_MODE_CONTEXT *)cm_00);
      encode_b_nonrd(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     (ThreadData_conflict *)CONCAT44(iVar8,in_stack_ffffffffffffff40),
                     (TokenExtra **)CONCAT44(iVar7,in_stack_ffffffffffffff38),
                     in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff68,(PARTITION_TYPE)local_e4,
                     (PICK_MODE_CONTEXT *)CONCAT44(mi_row_00,mi_col_00),(int *)x_00);
      if (((int)(in_R9D + mi_col_00) < *(int *)(lVar9 + 0xc)) && (BLOCK_8X8 < in_stack_00000010)) {
        pick_sb_modes_nonrd(in_RSI,tile_data_00,x_00,mi_row_00,mi_col_00,
                            (RD_STATS *)
                            CONCAT17(PVar1,CONCAT16(BVar2,CONCAT24(in_stack_ffffffffffffff74,
                                                                   local_e4))),(BLOCK_SIZE)lVar9,
                            (PICK_MODE_CONTEXT *)cm_00);
        encode_b_nonrd(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                       (ThreadData_conflict *)CONCAT44(iVar8,in_stack_ffffffffffffff40),
                       (TokenExtra **)CONCAT44(iVar7,in_stack_ffffffffffffff38),
                       in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff60
                       ,in_stack_ffffffffffffff68,(PARTITION_TYPE)local_e4,
                       (PICK_MODE_CONTEXT *)CONCAT44(mi_row_00,mi_col_00),(int *)x_00);
      }
      break;
    case '\x02':
      for (iVar7 = 0; iVar7 < 2; iVar7 = iVar7 + 1) {
        if (*(long *)(in_stack_00000018 + (long)iVar7 * 8 + 0x20) == 0) {
          pPVar4 = av1_alloc_pmc((AV1_COMP *)x,xd._7_1_,(PC_TREE_SHARED_BUFFERS *)mode_costs);
          *(PICK_MODE_CONTEXT **)(in_stack_00000018 + (long)iVar7 * 8 + 0x20) = pPVar4;
          if (*(long *)(in_stack_00000018 + (long)iVar7 * 8 + 0x20) == 0) {
            aom_internal_error(*(aom_internal_error_info **)
                                ((tile_data_00->tctx).palette_uv_color_index_cdf[1][2] + 2),
                               AOM_CODEC_MEM_ERROR,"Failed to allocate PICK_MODE_CONTEXT");
          }
        }
        else {
          av1_reset_pmc((PICK_MODE_CONTEXT *)0x12ebd02);
        }
      }
      pick_sb_modes_nonrd(in_RSI,tile_data_00,x_00,mi_row_00,mi_col_00,
                          (RD_STATS *)
                          CONCAT17(PVar1,CONCAT16(BVar2,CONCAT24(in_stack_ffffffffffffff74,local_e4)
                                                 )),(BLOCK_SIZE)lVar9,(PICK_MODE_CONTEXT *)cm_00);
      encode_b_nonrd(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     (ThreadData_conflict *)CONCAT44(iVar8,iVar7),
                     (TokenExtra **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff68,(PARTITION_TYPE)local_e4,
                     (PICK_MODE_CONTEXT *)CONCAT44(mi_row_00,mi_col_00),(int *)x_00);
      if (((int)(_BStack0000000000000008 + mi_col_00) < *(int *)(lVar9 + 0x10)) &&
         (BLOCK_8X8 < in_stack_00000010)) {
        pick_sb_modes_nonrd(in_RSI,tile_data_00,x_00,mi_row_00,mi_col_00,
                            (RD_STATS *)
                            CONCAT17(PVar1,CONCAT16(BVar2,CONCAT24(in_stack_ffffffffffffff74,
                                                                   local_e4))),(BLOCK_SIZE)lVar9,
                            (PICK_MODE_CONTEXT *)cm_00);
        encode_b_nonrd(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                       (ThreadData_conflict *)CONCAT44(iVar8,iVar7),
                       (TokenExtra **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff60
                       ,in_stack_ffffffffffffff68,(PARTITION_TYPE)local_e4,
                       (PICK_MODE_CONTEXT *)CONCAT44(mi_row_00,mi_col_00),(int *)x_00);
      }
      break;
    case '\x03':
      for (iVar7 = 0; iVar7 < 4; iVar7 = iVar7 + 1) {
        if (*(long *)(in_stack_00000018 + (long)iVar7 * 8 + 0xd0) == 0) {
          pPVar5 = av1_alloc_pc_tree_node((BLOCK_SIZE)((ulong)in_stack_fffffffffffffed8 >> 0x38));
          *(PC_TREE **)(in_stack_00000018 + (long)iVar7 * 8 + 0xd0) = pPVar5;
          if (*(long *)(in_stack_00000018 + (long)iVar7 * 8 + 0xd0) == 0) {
            aom_internal_error(*(aom_internal_error_info **)
                                ((tile_data_00->tctx).palette_uv_color_index_cdf[1][2] + 2),
                               AOM_CODEC_MEM_ERROR,"Failed to allocate PC_TREE");
          }
        }
        *(int *)(*(long *)(in_stack_00000018 + (long)iVar7 * 8 + 0xd0) + 0xf0) = iVar7;
      }
      if ((((*(int *)(in_RDI + 0x60ca0) == 0) ||
           (iVar7 = av1_is_leaf_split_partition
                              (in_stack_fffffffffffffef8,
                               (int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                               (int)in_stack_fffffffffffffef0,
                               (BLOCK_SIZE)((ulong)in_stack_fffffffffffffee8 >> 0x38)), iVar7 == 0))
          || (iVar7 = frame_is_intra_only(cm_00), iVar7 != 0)) || (BLOCK_64X64 < in_stack_00000010))
      {
        for (uVar6 = 0; (int)uVar6 < 4; uVar6 = uVar6 + 1) {
          if (((int)(in_R9D + ((int)uVar6 >> 1) * mi_col_00) < *(int *)(lVar9 + 0xc)) &&
             ((int)(_BStack0000000000000008 + (uVar6 & 1) * mi_col_00) < *(int *)(lVar9 + 0x10))) {
            av1_nonrd_use_partition
                      (pAVar11,pTVar10,in_RCX,in_R8,
                       (TokenExtra **)CONCAT44(in_R9D,in_stack_ffffffffffffffb0),
                       (int)((ulong)cm_00 >> 0x20),unaff_retaddr,BStack0000000000000008,
                       (PC_TREE *)CONCAT71(in_stack_00000011,in_stack_00000010));
          }
        }
        if ((((iVar8 == 0) && (iVar8 = frame_is_intra_only(cm_00), iVar8 == 0)) &&
            (((char)(pTVar10->mb).mode_costs.y_mode_costs[4][0xc][4] == '\0' &&
             (((*(int *)(in_RDI + 0x60dbc) != 0 &&
               (*(int *)(&x_00->plane[0].src_diff + (long)local_e4 * 5) <
                *(int *)((long)&x_00->plane[0].dqcoeff + (long)local_e4 * 0x28 + 4))) &&
              ((int)(in_R9D + mi_row_00) <= *(int *)(lVar9 + 0xc))))))) &&
           ((int)(_BStack0000000000000008 + mi_row_00) <= *(int *)(lVar9 + 0x10))) {
          direct_partition_merging
                    (in_stack_00000650,in_stack_00000648,in_stack_00000640,in_stack_00000638,
                     in_stack_00000634,in_stack_00000630,in_stack_00000660);
        }
      }
      else {
        try_merge(in_stack_00000148,(ThreadData_conflict *)pc_tree,
                  (TileDataEnc *)CONCAT71(in_stack_00000139,bsize),
                  (MB_MODE_INFO **)CONCAT44(in_stack_00000134,mi_col),in_stack_00000128,
                  in_stack_00000124,in_stack_00000160,in_stack_00000168,in_stack_00000170,
                  in_stack_00000178,in_stack_00000180,in_stack_00000188);
      }
      break;
    case '\x04':
    case '\x05':
    case '\x06':
    case '\a':
    case '\b':
    case '\t':
    }
  }
  return;
}

Assistant:

void av1_nonrd_use_partition(AV1_COMP *cpi, ThreadData *td,
                             TileDataEnc *tile_data, MB_MODE_INFO **mib,
                             TokenExtra **tp, int mi_row, int mi_col,
                             BLOCK_SIZE bsize, PC_TREE *pc_tree) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  // Only square blocks from 8x8 to 128x128 are supported
  assert(bsize >= BLOCK_8X8 && bsize <= BLOCK_128X128);
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  PARTITION_TYPE partition = (bsize >= BLOCK_8X8)
                                 ? get_partition(cm, mi_row, mi_col, bsize)
                                 : PARTITION_NONE;
  BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);
  assert(subsize <= BLOCK_LARGEST);
  const int pl = (bsize >= BLOCK_8X8)
                     ? partition_plane_context(xd, mi_row, mi_col, bsize)
                     : 0;

  RD_STATS dummy_cost;
  av1_invalid_rd_stats(&dummy_cost);

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;

  assert(mi_size_wide[bsize] == mi_size_high[bsize]);

  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  // Initialize default mode evaluation params
  set_mode_eval_params(cpi, x, DEFAULT_EVAL);

  x->reuse_inter_pred = cpi->sf.rt_sf.reuse_inter_pred_nonrd;

  int change_none_to_split = 0;
  if (partition == PARTITION_NONE &&
      cpi->sf.rt_sf.nonrd_check_partition_split == 1) {
    change_none_to_split =
        try_split_partition(cpi, td, tile_data, tile_info, tp, x, xd, mi_params,
                            mi_row, mi_col, bsize, pl, pc_tree);
    if (change_none_to_split) {
      partition = PARTITION_SPLIT;
      subsize = get_partition_subsize(bsize, partition);
      assert(subsize <= BLOCK_LARGEST);
    }
  }

  pc_tree->partitioning = partition;

  switch (partition) {
    case PARTITION_NONE:
      if (!pc_tree->none) {
        pc_tree->none = av1_alloc_pmc(cpi, bsize, &td->shared_coeff_buf);
        if (!pc_tree->none)
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      } else {
        av1_reset_pmc(pc_tree->none);
      }
      pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &dummy_cost, bsize,
                          pc_tree->none);
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, bsize,
                     partition, pc_tree->none, NULL);
      break;
    case PARTITION_VERT:
      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        if (!pc_tree->vertical[i]) {
          pc_tree->vertical[i] =
              av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
          if (!pc_tree->vertical[i])
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
        } else {
          av1_reset_pmc(pc_tree->vertical[i]);
        }
      }
      pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &dummy_cost,
                          subsize, pc_tree->vertical[0]);
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, subsize,
                     PARTITION_VERT, pc_tree->vertical[0], NULL);
      if (mi_col + hbs < mi_params->mi_cols && bsize > BLOCK_8X8) {
        pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col + hbs,
                            &dummy_cost, subsize, pc_tree->vertical[1]);
        encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col + hbs, 0, subsize,
                       PARTITION_VERT, pc_tree->vertical[1], NULL);
      }
      break;
    case PARTITION_HORZ:
      for (int i = 0; i < SUB_PARTITIONS_RECT; ++i) {
        if (!pc_tree->horizontal[i]) {
          pc_tree->horizontal[i] =
              av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
          if (!pc_tree->horizontal[i])
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
        } else {
          av1_reset_pmc(pc_tree->horizontal[i]);
        }
      }
      pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &dummy_cost,
                          subsize, pc_tree->horizontal[0]);
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, subsize,
                     PARTITION_HORZ, pc_tree->horizontal[0], NULL);

      if (mi_row + hbs < mi_params->mi_rows && bsize > BLOCK_8X8) {
        pick_sb_modes_nonrd(cpi, tile_data, x, mi_row + hbs, mi_col,
                            &dummy_cost, subsize, pc_tree->horizontal[1]);
        encode_b_nonrd(cpi, tile_data, td, tp, mi_row + hbs, mi_col, 0, subsize,
                       PARTITION_HORZ, pc_tree->horizontal[1], NULL);
      }
      break;
    case PARTITION_SPLIT:
      for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
        if (!pc_tree->split[i]) {
          pc_tree->split[i] = av1_alloc_pc_tree_node(subsize);
          if (!pc_tree->split[i])
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PC_TREE");
        }
        pc_tree->split[i]->index = i;
      }
      if (cpi->sf.rt_sf.nonrd_check_partition_merge_mode &&
          av1_is_leaf_split_partition(cm, mi_row, mi_col, bsize) &&
          !frame_is_intra_only(cm) && bsize <= BLOCK_64X64) {
        try_merge(cpi, td, tile_data, mib, tp, mi_row, mi_col, bsize, pc_tree,
                  partition, subsize, pl);
      } else {
        for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
          int x_idx = (i & 1) * hbs;
          int y_idx = (i >> 1) * hbs;
          int jj = i >> 1, ii = i & 0x01;
          if ((mi_row + y_idx >= mi_params->mi_rows) ||
              (mi_col + x_idx >= mi_params->mi_cols))
            continue;
          av1_nonrd_use_partition(
              cpi, td, tile_data,
              mib + jj * hbs * mi_params->mi_stride + ii * hbs, tp,
              mi_row + y_idx, mi_col + x_idx, subsize, pc_tree->split[i]);
        }

        if (!change_none_to_split) {
          // Note: Palette, cfl are not supported.
          if (!frame_is_intra_only(cm) && !tile_data->allow_update_cdf &&
              cpi->sf.rt_sf.partition_direct_merging &&
              mode_costs->partition_cost[pl][PARTITION_NONE] <
                  mode_costs->partition_cost[pl][PARTITION_SPLIT] &&
              (mi_row + bs <= mi_params->mi_rows) &&
              (mi_col + bs <= mi_params->mi_cols)) {
            direct_partition_merging(cpi, td, tile_data, mib, mi_row, mi_col,
                                     bsize);
          }
        }
      }
      break;
    case PARTITION_VERT_A:
    case PARTITION_VERT_B:
    case PARTITION_HORZ_A:
    case PARTITION_HORZ_B:
    case PARTITION_HORZ_4:
    case PARTITION_VERT_4:
      assert(0 && "Cannot handle extended partition types");
    default: assert(0); break;
  }
}